

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  size_type sVar1;
  size_t sVar2;
  pointer __dest;
  
  sVar1 = result->_M_string_length;
  std::__cxx11::string::resize
            ((ulong)result,
             (char)a->piece_size_ + (char)sVar1 + (char)b->piece_size_ + (char)c->piece_size_);
  __dest = (result->_M_dataplus)._M_p + sVar1;
  memcpy(__dest,a->piece_data_,a->piece_size_);
  sVar2 = a->piece_size_;
  memcpy(__dest + sVar2,b->piece_data_,b->piece_size_);
  memcpy(__dest + sVar2 + b->piece_size_,c->piece_data_,c->piece_size_);
  return;
}

Assistant:

void StrAppend(string *result,
               const AlphaNum &a, const AlphaNum &b, const AlphaNum &c) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}